

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CloseSavepoints(sqlite3 *db)

{
  Savepoint *p;
  Savepoint *pTmp;
  sqlite3 *db_local;
  
  while (db->pSavepoint != (Savepoint *)0x0) {
    p = db->pSavepoint;
    db->pSavepoint = p->pNext;
    sqlite3DbFree(db,p);
  }
  db->nSavepoint = 0;
  db->nStatement = 0;
  db->isTransactionSavepoint = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CloseSavepoints(sqlite3 *db){
  while( db->pSavepoint ){
    Savepoint *pTmp = db->pSavepoint;
    db->pSavepoint = pTmp->pNext;
    sqlite3DbFree(db, pTmp);
  }
  db->nSavepoint = 0;
  db->nStatement = 0;
  db->isTransactionSavepoint = 0;
}